

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

void * getXattr(char *path,char *name,size_t *sizep)

{
  size_t __size;
  void *__value;
  size_t sVar1;
  
  __value = (void *)0x0;
  __size = lgetxattr(path,name,(void *)0x0,0);
  if (-1 < (long)__size) {
    __value = malloc(__size);
    __size = lgetxattr(path,name,__value,__size);
    if ((long)__size < 0) {
      free(__value);
      __value = (void *)0x0;
    }
  }
  sVar1 = 0;
  if (0 < (long)__size) {
    sVar1 = __size;
  }
  *sizep = sVar1;
  return __value;
}

Assistant:

void *
getXattr(const char *path, const char *name, size_t *sizep)
{
	void *value = NULL;
#if ARCHIVE_XATTR_SUPPORT
	ssize_t size;
#if ARCHIVE_XATTR_LINUX
	size = lgetxattr(path, name, NULL, 0);
#elif ARCHIVE_XATTR_DARWIN
	size = getxattr(path, name, NULL, 0, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
	size = lgetea(path, name, NULL, 0);
#elif ARCHIVE_XATTR_FREEBSD
	size = extattr_get_link(path, EXTATTR_NAMESPACE_USER, name + 5,
	    NULL, 0);
#endif

	if (size >= 0) {
		value = malloc(size);
#if ARCHIVE_XATTR_LINUX
		size = lgetxattr(path, name, value, size);
#elif ARCHIVE_XATTR_DARWIN
		size = getxattr(path, name, value, size, 0, XATTR_NOFOLLOW);
#elif ARCHIVE_XATTR_AIX
		size = lgetea(path, name, value, size);
#elif ARCHIVE_XATTR_FREEBSD
		size = extattr_get_link(path, EXTATTR_NAMESPACE_USER, name + 5,
		    value, size);
#endif
		if (size < 0) {
			free(value);
			value = NULL;
		}
	}
	if (size < 0)
		*sizep = 0;
	else
		*sizep = (size_t)size;
#else	/* !ARCHIVE_XATTR_SUPPORT */
	(void)path;	/* UNUSED */
	(void)name;	/* UNUSED */
	*sizep = 0;
#endif 	/* !ARCHIVE_XATTR_SUPPORT */
	return (value);
}